

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::ShutdownClearSourceLists(ScriptContext *this)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *this_00;
  code *pcVar4;
  bool bVar5;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    if ((this->super_ScriptContextBase).isClosed == true) {
      pLVar6 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(&this->sourceList);
      if (0 < (pLVar6->
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
              ).count) {
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        lVar11 = 0;
        do {
          pRVar1 = (pLVar6->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[lVar11].ptr;
          if ((((((ulong)pRVar1 & 1) == 0 &&
                 pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
               (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0))
              && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) &&
             (*(int *)((long)plVar3 + 0x1c) != 0)) {
            uVar10 = 0;
            do {
              iVar12 = *(int *)(*plVar3 + uVar10 * 4);
              while (iVar12 != -1) {
                lVar9 = (long)iVar12;
                iVar12 = *(int *)(plVar3[1] + 8 + lVar9 * 0x10);
                this_00 = *(FunctionBody **)(plVar3[1] + lVar9 * 0x10);
                if (this_00 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar7 = 1;
                  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar5) goto LAB_0078f35f;
                  *puVar7 = 0;
                }
                pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
                if (pSVar8 != this) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar7 = 1;
                  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                              ,400,"(functionBody->GetScriptContext() == this)",
                                              "functionBody->GetScriptContext() == this");
                  if (!bVar5) {
LAB_0078f35f:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *puVar7 = 0;
                }
                FunctionBody::CleanupSourceInfo(this_00,true);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < *(uint *)((long)plVar3 + 0x1c));
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (pLVar6->
                          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                          ).count);
      }
    }
    EnsureClearDebugDocument(this);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
    ::Unroot(&this->sourceList,this->recycler);
  }
  if ((this->calleeUtf8SourceInfoList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
    ::Unroot(&this->calleeUtf8SourceInfoList,this->recycler);
    return;
  }
  return;
}

Assistant:

void ScriptContext::ShutdownClearSourceLists()
    {
        if (this->sourceList)
        {
            // In the unclean shutdown case, we might not have destroyed the script context when
            // this is called- in which case, skip doing this work and simply release the source list
            // so that it doesn't show up as a leak. Since we're doing unclean shutdown, it's ok to
            // skip cleanup here for expediency.
            if (this->isClosed)
            {
                this->MapFunction([this](Js::FunctionBody* functionBody) {
                    Assert(functionBody->GetScriptContext() == this);
                    functionBody->CleanupSourceInfo(true);
                });
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            EnsureClearDebugDocument();
#endif

            // Don't need the source list any more so ok to release
            this->sourceList.Unroot(this->GetRecycler());
        }

        if (this->calleeUtf8SourceInfoList)
        {
            this->calleeUtf8SourceInfoList.Unroot(this->GetRecycler());
        }
    }